

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O0

char * TEST_bump_stacktrace_implementation(char *suggestion)

{
  int iVar1;
  int local_20;
  int i;
  int n;
  char *suggestion_local;
  
  if (!get_stack_impl_inited) {
    fprintf(_stderr,"Supported stacktrace methods:\n");
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      fprintf(_stderr,"* %s\n",all_impls[local_20]->name);
    }
    fprintf(_stderr,"\n\n");
    get_stack_impl_inited = true;
  }
  do {
    if (TEST_bump_stacktrace_implementation::selection == 4) {
      return (char *)0x0;
    }
    iVar1 = TEST_bump_stacktrace_implementation::selection + 1;
    get_stack_impl = all_impls[TEST_bump_stacktrace_implementation::selection];
    TEST_bump_stacktrace_implementation::selection = iVar1;
  } while (((suggestion != (char *)0x0) &&
           (iVar1 = strcmp(suggestion,get_stack_impl->name), iVar1 != 0)) ||
          (get_stack_impl == &impl__null));
  return get_stack_impl->name;
}

Assistant:

const char* TEST_bump_stacktrace_implementation(const char* suggestion) {
  static int selection;
  constexpr int n = sizeof(all_impls)/sizeof(all_impls[0]);

  if (!get_stack_impl_inited) {
    fprintf(stderr, "Supported stacktrace methods:\n");
    for (int i = 0; i < n; i++) {
      fprintf(stderr, "* %s\n", all_impls[i]->name);
    }
    fprintf(stderr, "\n\n");
    get_stack_impl_inited = true;
  }

  do {
    if (selection == n) {
      return nullptr;
    }
    get_stack_impl = all_impls[selection++];

    if (suggestion && strcmp(suggestion, get_stack_impl->name) != 0) {
      continue;
    }
    if (get_stack_impl == &impl__null) {
      // skip null implementation
      continue;
    }
#ifdef HAVE_GST_arm
    if (get_stack_impl == &impl__arm) {
      // "arm" backtracer is hopelessly broken. So don't test. We
      // still ship it, though, just in case.
      continue;
    }
#endif  // HAVE_GST_arm
#if defined(HAVE_GST_generic_fp) && (!__x86_64__ && !__i386__ && !__aarch64__ && !__riscv)
    // Those "major" architectures have functional frame pointer
    // backtracer and they're built with -fno-omit-frame-pointers
    // -mno-omit-leaf-frame-pointer. So we do expect those tests to
    // succeed. Everyone else (e.g. 32-bit legacy arm) is unlikely to
    // pass.
    if (get_stack_impl == &impl__generic_fp || get_stack_impl == &impl__generic_fp_unsafe) {
      continue;
    }
#endif  // generic_fp && !"good architecture"
    break;
  } while (true);

  return get_stack_impl->name;
}